

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O1

void Ntk_SymFunDeriveNpn(word *pFun,int nVars,int *pComp)

{
  int iVar1;
  word wVar2;
  long lVar3;
  void *__dest;
  size_t sVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  word *pwVar13;
  word *pwVar14;
  ulong uVar15;
  ulong uVar16;
  word *pLimit;
  size_t __nmemb;
  bool bVar17;
  
  uVar10 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    uVar10 = 1;
  }
  __nmemb = (size_t)(int)uVar10;
  __dest = calloc(__nmemb,8);
  if (0 < (int)uVar10) {
    sVar4 = 0;
    do {
      *(word *)((long)__dest + sVar4 * 8) = ~pFun[sVar4];
      sVar4 = sVar4 + 1;
    } while (__nmemb != sVar4);
  }
  uVar16 = (ulong)uVar10;
  uVar15 = uVar16;
  do {
    if ((int)uVar15 < 1) {
      bVar17 = true;
      break;
    }
    lVar3 = uVar15 - 1;
    uVar5 = *(ulong *)((long)__dest + uVar15 * 8 + -8);
    bVar17 = uVar5 < pFun[lVar3];
    uVar15 = uVar15 - 1;
  } while (uVar5 == pFun[lVar3]);
  if ((0 < (int)uVar10) && (!bVar17)) {
    memcpy(__dest,pFun,uVar16 * 8);
  }
  if (nVars != 0x1f) {
    uVar8 = 1 << ((byte)nVars & 0x1f);
    if ((int)uVar8 < 2) {
      uVar8 = 1;
    }
    uVar15 = 0;
    do {
      iVar1 = pComp[uVar15];
      uVar5 = uVar16;
      if (uVar10 == 1) {
        bVar6 = (byte)(1L << ((byte)iVar1 & 0x3f));
        *pFun = (s_Truths6[iVar1] & *pFun) >> (bVar6 & 0x3f) |
                *pFun << (bVar6 & 0x3f) & s_Truths6[iVar1];
      }
      else if (iVar1 < 6) {
        if (0 < (int)uVar10) {
          uVar7 = s_Truths6[iVar1];
          uVar12 = 0;
          do {
            bVar6 = (byte)(1L << ((byte)iVar1 & 0x3f));
            pFun[uVar12] = (pFun[uVar12] & uVar7) >> (bVar6 & 0x3f) |
                           pFun[uVar12] << (bVar6 & 0x3f) & uVar7;
            uVar12 = uVar12 + 1;
          } while (uVar16 != uVar12);
        }
      }
      else if (0 < (int)uVar10) {
        bVar6 = (byte)(iVar1 + -6);
        uVar9 = 1 << (bVar6 & 0x1f);
        iVar11 = 2 << (bVar6 & 0x1f);
        uVar7 = 1;
        if (1 < (int)uVar9) {
          uVar7 = (ulong)uVar9;
        }
        pwVar13 = pFun + (int)uVar9;
        pwVar14 = pFun;
        do {
          if (iVar1 + -6 != 0x1f) {
            uVar12 = 0;
            do {
              wVar2 = pwVar14[uVar12];
              pwVar14[uVar12] = pwVar13[uVar12];
              pwVar13[uVar12] = wVar2;
              uVar12 = uVar12 + 1;
            } while (uVar7 != uVar12);
          }
          pwVar14 = pwVar14 + iVar11;
          pwVar13 = pwVar13 + iVar11;
        } while (pwVar14 < pFun + __nmemb);
      }
      do {
        uVar7 = uVar16;
        if ((int)uVar5 < 1) goto LAB_00317f38;
        lVar3 = uVar5 - 1;
        uVar12 = *(ulong *)((long)__dest + uVar5 * 8 + -8);
        uVar5 = uVar5 - 1;
      } while (uVar12 == pFun[lVar3]);
      if (uVar12 < pFun[lVar3]) {
LAB_00317f38:
        if (0 < (int)uVar10) {
          uVar5 = 0;
          do {
            pFun[uVar5] = ~pFun[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar16 != uVar5);
        }
      }
      else if (0 < (int)uVar10) {
        memcpy(__dest,pFun,uVar16 * 8);
        goto LAB_00317f38;
      }
      do {
        if ((int)uVar7 < 1) {
          bVar17 = true;
          break;
        }
        lVar3 = uVar7 - 1;
        uVar5 = *(ulong *)((long)__dest + uVar7 * 8 + -8);
        bVar17 = uVar5 < pFun[lVar3];
        uVar7 = uVar7 - 1;
      } while (uVar5 == pFun[lVar3]);
      if ((0 < (int)uVar10) && (!bVar17)) {
        memcpy(__dest,pFun,uVar16 * 8);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar8);
  }
  if (0 < (int)uVar10) {
    memcpy(pFun,__dest,uVar16 << 3);
  }
  if (__dest == (void *)0x0) {
    return;
  }
  free(__dest);
  return;
}

Assistant:

void Ntk_SymFunDeriveNpn( word * pFun, int nVars, int * pComp )
{
    int i, nWords = Abc_TtWordNum(nVars);
    word * pFunB = ABC_CALLOC( word, nWords );
    Abc_TtCopy( pFunB, pFun, nWords, 1 );
    if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
        Abc_TtCopy( pFunB, pFun, nWords, 0 );
    for ( i = 0; i < (1 << nVars); i++ )
    {
        Abc_TtFlip( pFun, nWords, pComp[i] );
        if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
            Abc_TtCopy( pFunB, pFun, nWords, 0 );
        Abc_TtNot( pFun, nWords );
        if ( Abc_TtCompareRev(pFunB, pFun, nWords) == 1 )
            Abc_TtCopy( pFunB, pFun, nWords, 0 );
    }
    //Ntk_SymTryRandomFlips( pFun, pFunB, nVars );
    Abc_TtCopy( pFun, pFunB, nWords, 0 );
    ABC_FREE( pFunB );
}